

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# planar_functions.cc
# Opt level: O0

int I400ToI400(uint8_t *src_y,int src_stride_y,uint8_t *dst_y,int dst_stride_y,int width,int height)

{
  long in_RDX;
  int in_ESI;
  uint8_t *in_RDI;
  int in_R8D;
  int in_R9D;
  uint8_t *unaff_retaddr;
  int in_stack_ffffffffffffffe8;
  int in_stack_fffffffffffffffc;
  int iVar1;
  
  if ((((in_RDI == (uint8_t *)0x0) || (in_RDX == 0)) || (in_R8D < 1)) || (in_R9D == 0)) {
    iVar1 = -1;
  }
  else {
    if (in_R9D < 0) {
      in_RDI = in_RDI + (-1 - in_R9D) * in_ESI;
      in_ESI = -in_ESI;
    }
    CopyPlane(unaff_retaddr,in_stack_fffffffffffffffc,in_RDI,in_ESI,in_stack_ffffffffffffffe8,
              (int)((ulong)in_RDX >> 0x20));
    iVar1 = 0;
  }
  return iVar1;
}

Assistant:

LIBYUV_API
int I400ToI400(const uint8_t* src_y,
               int src_stride_y,
               uint8_t* dst_y,
               int dst_stride_y,
               int width,
               int height) {
  if (!src_y || !dst_y || width <= 0 || height == 0) {
    return -1;
  }
  // Negative height means invert the image.
  if (height < 0) {
    height = -height;
    src_y = src_y + (height - 1) * src_stride_y;
    src_stride_y = -src_stride_y;
  }
  CopyPlane(src_y, src_stride_y, dst_y, dst_stride_y, width, height);
  return 0;
}